

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StuntDouble.hpp
# Opt level: O3

Vector3d * __thiscall
OpenMD::StuntDouble::body2Lab
          (Vector3d *__return_storage_ptr__,StuntDouble *this,Vector3d *v,int frame)

{
  double dVar1;
  double *pdVar2;
  long lVar3;
  double *pdVar4;
  long lVar5;
  double (*__return_storage_ptr___00) [3];
  Vector<double,_3U> result_1;
  SquareMatrix3<double> result;
  double local_c8 [4];
  double local_a8 [18];
  
  __return_storage_ptr___00 = (double (*) [3])(local_a8 + 9);
  getA((RotMat3x3d *)__return_storage_ptr___00,this,frame);
  pdVar2 = local_a8;
  local_a8[6] = 0.0;
  local_a8[7] = 0.0;
  local_a8[4] = 0.0;
  local_a8[5] = 0.0;
  local_a8[2] = 0.0;
  local_a8[3] = 0.0;
  local_a8[0] = 0.0;
  local_a8[1] = 0.0;
  local_a8[8] = 0.0;
  lVar3 = 0;
  do {
    lVar5 = 0;
    pdVar4 = pdVar2;
    do {
      *pdVar4 = (((SquareMatrix<double,_3> *)*__return_storage_ptr___00)->
                super_RectMatrix<double,_3U,_3U>).data_[0][lVar5];
      lVar5 = lVar5 + 1;
      pdVar4 = pdVar4 + 3;
    } while (lVar5 != 3);
    lVar3 = lVar3 + 1;
    pdVar2 = pdVar2 + 1;
    __return_storage_ptr___00 = __return_storage_ptr___00 + 1;
  } while (lVar3 != 3);
  local_c8[0] = 0.0;
  local_c8[1] = 0.0;
  local_c8[2] = 0.0;
  pdVar2 = local_a8;
  lVar3 = 0;
  do {
    dVar1 = local_c8[lVar3];
    lVar5 = 0;
    do {
      dVar1 = dVar1 + pdVar2[lVar5] * (v->super_Vector<double,_3U>).data_[lVar5];
      lVar5 = lVar5 + 1;
    } while (lVar5 != 3);
    local_c8[lVar3] = dVar1;
    lVar3 = lVar3 + 1;
    pdVar2 = pdVar2 + 3;
  } while (lVar3 != 3);
  (__return_storage_ptr__->super_Vector<double,_3U>).data_[2] = local_c8[2];
  (__return_storage_ptr__->super_Vector<double,_3U>).data_[0] = local_c8[0];
  (__return_storage_ptr__->super_Vector<double,_3U>).data_[1] = local_c8[1];
  return __return_storage_ptr__;
}

Assistant:

Vector3d body2Lab(const Vector3d& v, int frame) {
      return getA(frame).transpose() * v;
    }